

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O1

void crnlib::crn_comp::append_vec(vector<unsigned_char> *a,void *p,uint size)

{
  uint uVar1;
  uint min_new_capacity;
  
  if (size != 0) {
    uVar1 = a->m_size;
    min_new_capacity = uVar1 + size;
    if (!CARRY4(uVar1,size)) {
      if (a->m_capacity < min_new_capacity) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)a,min_new_capacity,size == 1,1,(object_mover)0x0,false);
      }
      memset(a->m_p + a->m_size,0,(ulong)(min_new_capacity - a->m_size));
    }
    a->m_size = min_new_capacity;
    memcpy(a->m_p + uVar1,p,(ulong)size);
    return;
  }
  return;
}

Assistant:

void crn_comp::append_vec(crnlib::vector<uint8>& a, const void* p, uint size) {
  if (size) {
    uint ofs = a.size();
    a.resize(ofs + size);

    memcpy(&a[ofs], p, size);
  }
}